

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinAsciiLower
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  UString *pUVar1;
  HeapEntity *pHVar2;
  _func_int **pp_Var3;
  size_type sVar4;
  allocator_type *in_RCX;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  Value VVar5;
  UString new_str;
  undefined1 local_60 [32];
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  local_40;
  long local_30;
  Type local_24;
  
  pUVar1 = (UString *)(local_60 + 0x10);
  local_60._0_8_ = pUVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"asciiLower","");
  local_24 = STRING;
  __l._M_len = 1;
  __l._M_array = &local_24;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)&local_40,__l,in_RCX);
  validateBuiltinArgs(this,loc,(string *)local_60,args,
                      (vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                       *)&local_40);
  if ((void *)local_40._M_allocated_capacity != (void *)0x0) {
    operator_delete((void *)local_40._M_allocated_capacity,local_30 - local_40._0_8_);
  }
  if ((UString *)local_60._0_8_ != pUVar1) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  pHVar2 = (((args->
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
             )._M_impl.super__Vector_impl_data._M_start)->v).h;
  pp_Var3 = pHVar2[1]._vptr_HeapEntity;
  local_60._0_8_ = pUVar1;
  std::__cxx11::u32string::_M_construct<char32_t*>
            ((u32string *)local_60,pp_Var3,(long)pp_Var3 + *(long *)&pHVar2[1].mark * 4);
  if (local_60._8_8_ != 0) {
    sVar4 = 0;
    do {
      if (*(uint *)(local_60._0_8_ + sVar4 * 4) - 0x41 < 0x1a) {
        *(uint *)(local_60._0_8_ + sVar4 * 4) = *(uint *)(local_60._0_8_ + sVar4 * 4) | 0x20;
      }
      sVar4 = sVar4 + 1;
    } while (local_60._8_8_ != sVar4);
  }
  VVar5 = makeString(this,(UString *)local_60._0_8_);
  (this->scratch).t = STRING;
  (this->scratch).v = VVar5._0_8_;
  if ((UString *)local_60._0_8_ != pUVar1) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ * 4 + 4);
  }
  return (AST *)0x0;
}

Assistant:

const AST *builtinAsciiLower(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "asciiLower", args, {Value::STRING});
        const auto *str = static_cast<const HeapString *>(args[0].v.h);
        UString new_str(str->value);
        for (size_t i = 0; i < new_str.size(); ++i) {
            if (new_str[i] >= 'A' && new_str[i] <= 'Z') {
                new_str[i] = new_str[i] - 'A' + 'a';
            }
        }
        scratch = makeString(new_str);
        return nullptr;
    }